

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarSimSec(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Ssw_Pars_t *pPars)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Man_t *pAStack_38;
  int RetValue;
  Aig_Man_t *pMan2;
  Aig_Man_t *pMan1;
  Ssw_Pars_t *pPars_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pAStack_38 = (Aig_Man_t *)0x0;
  p = Abc_NtkToDar(pNtk1,0,1);
  if (p == (Aig_Man_t *)0x0) {
    Abc_Print(1,"Converting miter into AIG has failed.\n");
    pNtk1_local._4_4_ = -1;
  }
  else {
    iVar1 = Aig_ManRegNum(p);
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(pMan1) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0xc35,"int Abc_NtkDarSimSec(Abc_Ntk_t *, Abc_Ntk_t *, Ssw_Pars_t *)");
    }
    if (pNtk2 != (Abc_Ntk_t *)0x0) {
      pAStack_38 = Abc_NtkToDar(pNtk2,0,1);
      if (pAStack_38 == (Aig_Man_t *)0x0) {
        Abc_Print(1,"Converting miter into AIG has failed.\n");
        return -1;
      }
      iVar1 = Aig_ManRegNum(pAStack_38);
      if (iVar1 < 1) {
        __assert_fail("Aig_ManRegNum(pMan2) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                      ,0xc3f,"int Abc_NtkDarSimSec(Abc_Ntk_t *, Abc_Ntk_t *, Ssw_Pars_t *)");
      }
    }
    pNtk1_local._4_4_ = Ssw_SecWithSimilarity(p,pAStack_38,pPars);
    Aig_ManStop(p);
    if (pAStack_38 != (Aig_Man_t *)0x0) {
      Aig_ManStop(pAStack_38);
    }
  }
  return pNtk1_local._4_4_;
}

Assistant:

int Abc_NtkDarSimSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pMan1, * pMan2 = NULL;
    int RetValue;
    // derive AIG manager
    pMan1 = Abc_NtkToDar( pNtk1, 0, 1 );
    if ( pMan1 == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( Aig_ManRegNum(pMan1) > 0 );
    // derive AIG manager
    if ( pNtk2 )
    {
        pMan2 = Abc_NtkToDar( pNtk2, 0, 1 );
        if ( pMan2 == NULL )
        {
            Abc_Print( 1, "Converting miter into AIG has failed.\n" );
            return -1;
        }
        assert( Aig_ManRegNum(pMan2) > 0 );
    }

    // perform verification
    RetValue = Ssw_SecWithSimilarity( pMan1, pMan2, pPars );
    Aig_ManStop( pMan1 );
    if ( pMan2 )
        Aig_ManStop( pMan2 );
    return RetValue;
}